

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O1

void __thiscall
btRigidBody::setupRigidBody(btRigidBody *this,btRigidBodyConstructionInfo *constructionInfo)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  btMotionState *pbVar7;
  undefined1 auVar8 [16];
  btScalar bVar9;
  btScalar bVar10;
  btScalar bVar11;
  undefined8 uVar12;
  int iVar13;
  undefined1 auVar14 [16];
  
  (this->super_btCollisionObject).m_internalType = 2;
  (this->m_linearVelocity).m_floats[0] = 0.0;
  (this->m_linearVelocity).m_floats[1] = 0.0;
  (this->m_linearVelocity).m_floats[2] = 0.0;
  (this->m_linearVelocity).m_floats[3] = 0.0;
  (this->m_angularVelocity).m_floats[0] = 0.0;
  (this->m_angularVelocity).m_floats[1] = 0.0;
  (this->m_angularVelocity).m_floats[2] = 0.0;
  (this->m_angularVelocity).m_floats[3] = 0.0;
  (this->m_angularFactor).m_floats[0] = 1.0;
  (this->m_angularFactor).m_floats[1] = 1.0;
  (this->m_angularFactor).m_floats[2] = 1.0;
  auVar8 = _DAT_001f53f0;
  (this->m_angularFactor).m_floats[3] = 0.0;
  *(long *)(this->m_linearFactor).m_floats = DAT_001f53f0;
  (this->m_linearFactor).m_floats[2] = 1.0;
  *(undefined8 *)((this->m_linearFactor).m_floats + 3) = 0;
  (this->m_gravity).m_floats[1] = 0.0;
  (this->m_gravity).m_floats[2] = 0.0;
  *(undefined8 *)((this->m_gravity).m_floats + 3) = 0;
  (this->m_gravity_acceleration).m_floats[1] = 0.0;
  (this->m_gravity_acceleration).m_floats[2] = 0.0;
  (this->m_gravity_acceleration).m_floats[3] = 0.0;
  (this->m_totalForce).m_floats[0] = 0.0;
  (this->m_totalForce).m_floats[1] = 0.0;
  (this->m_totalForce).m_floats[2] = 0.0;
  (this->m_totalForce).m_floats[3] = 0.0;
  (this->m_totalTorque).m_floats[0] = 0.0;
  (this->m_totalTorque).m_floats[1] = 0.0;
  (this->m_totalTorque).m_floats[2] = 0.0;
  (this->m_totalTorque).m_floats[3] = 0.0;
  uVar1 = constructionInfo->m_linearDamping;
  uVar4 = constructionInfo->m_angularDamping;
  auVar14._4_4_ = uVar4;
  auVar14._0_4_ = uVar1;
  auVar14._8_8_ = 0;
  auVar14 = minps(auVar8,auVar14);
  this->m_linearDamping = (btScalar)(-(uint)(0.0 <= (float)uVar1) & auVar14._0_4_);
  this->m_angularDamping = (btScalar)(-(uint)(0.0 <= (float)uVar4) & auVar14._4_4_);
  bVar9 = constructionInfo->m_angularSleepingThreshold;
  this->m_linearSleepingThreshold = constructionInfo->m_linearSleepingThreshold;
  this->m_angularSleepingThreshold = bVar9;
  pbVar7 = constructionInfo->m_motionState;
  this->m_optionalMotionState = pbVar7;
  this->m_contactSolverType = 0;
  this->m_frictionSolverType = 0;
  this->m_additionalDamping = constructionInfo->m_additionalDamping;
  bVar9 = constructionInfo->m_additionalLinearDampingThresholdSqr;
  bVar10 = constructionInfo->m_additionalAngularDampingThresholdSqr;
  bVar11 = constructionInfo->m_additionalAngularDampingFactor;
  this->m_additionalDampingFactor = constructionInfo->m_additionalDampingFactor;
  this->m_additionalLinearDampingThresholdSqr = bVar9;
  this->m_additionalAngularDampingThresholdSqr = bVar10;
  this->m_additionalAngularDampingFactor = bVar11;
  if (pbVar7 == (btMotionState *)0x0) {
    uVar12 = *(undefined8 *)((constructionInfo->m_startWorldTransform).m_basis.m_el[0].m_floats + 2)
    ;
    *(undefined8 *)(this->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats =
         *(undefined8 *)(constructionInfo->m_startWorldTransform).m_basis.m_el[0].m_floats;
    *(undefined8 *)((this->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats + 2) =
         uVar12;
    uVar12 = *(undefined8 *)((constructionInfo->m_startWorldTransform).m_basis.m_el[1].m_floats + 2)
    ;
    *(undefined8 *)(this->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats =
         *(undefined8 *)(constructionInfo->m_startWorldTransform).m_basis.m_el[1].m_floats;
    *(undefined8 *)((this->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats + 2) =
         uVar12;
    uVar12 = *(undefined8 *)((constructionInfo->m_startWorldTransform).m_basis.m_el[2].m_floats + 2)
    ;
    *(undefined8 *)(this->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats =
         *(undefined8 *)(constructionInfo->m_startWorldTransform).m_basis.m_el[2].m_floats;
    *(undefined8 *)((this->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats + 2) =
         uVar12;
    uVar12 = *(undefined8 *)((constructionInfo->m_startWorldTransform).m_origin.m_floats + 2);
    *(undefined8 *)(this->super_btCollisionObject).m_worldTransform.m_origin.m_floats =
         *(undefined8 *)(constructionInfo->m_startWorldTransform).m_origin.m_floats;
    *(undefined8 *)((this->super_btCollisionObject).m_worldTransform.m_origin.m_floats + 2) = uVar12
    ;
  }
  else {
    (*pbVar7->_vptr_btMotionState[2])(pbVar7,&(this->super_btCollisionObject).m_worldTransform);
  }
  uVar12 = *(undefined8 *)
            ((this->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats + 2);
  *(undefined8 *)
   (this->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el[0].m_floats =
       *(undefined8 *)(this->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats;
  *(undefined8 *)
   ((this->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el[0].m_floats + 2) =
       uVar12;
  uVar12 = *(undefined8 *)
            ((this->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats + 2);
  *(undefined8 *)
   (this->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el[1].m_floats =
       *(undefined8 *)(this->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats;
  *(undefined8 *)
   ((this->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el[1].m_floats + 2) =
       uVar12;
  uVar12 = *(undefined8 *)
            ((this->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats + 2);
  *(undefined8 *)
   (this->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el[2].m_floats =
       *(undefined8 *)(this->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats;
  *(undefined8 *)
   ((this->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el[2].m_floats + 2) =
       uVar12;
  uVar12 = *(undefined8 *)((this->super_btCollisionObject).m_worldTransform.m_origin.m_floats + 2);
  *(undefined8 *)(this->super_btCollisionObject).m_interpolationWorldTransform.m_origin.m_floats =
       *(undefined8 *)(this->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
  *(undefined8 *)
   ((this->super_btCollisionObject).m_interpolationWorldTransform.m_origin.m_floats + 2) = uVar12;
  (this->super_btCollisionObject).m_interpolationLinearVelocity.m_floats[0] = 0.0;
  (this->super_btCollisionObject).m_interpolationLinearVelocity.m_floats[1] = 0.0;
  (this->super_btCollisionObject).m_interpolationLinearVelocity.m_floats[2] = 0.0;
  (this->super_btCollisionObject).m_interpolationLinearVelocity.m_floats[3] = 0.0;
  (this->super_btCollisionObject).m_interpolationAngularVelocity.m_floats[0] = 0.0;
  (this->super_btCollisionObject).m_interpolationAngularVelocity.m_floats[1] = 0.0;
  (this->super_btCollisionObject).m_interpolationAngularVelocity.m_floats[2] = 0.0;
  (this->super_btCollisionObject).m_interpolationAngularVelocity.m_floats[3] = 0.0;
  (this->super_btCollisionObject).m_friction = constructionInfo->m_friction;
  uVar2 = constructionInfo->m_rollingFriction;
  uVar5 = constructionInfo->m_restitution;
  (this->super_btCollisionObject).m_restitution = (btScalar)uVar5;
  (this->super_btCollisionObject).m_rollingFriction = (btScalar)uVar2;
  (*(this->super_btCollisionObject)._vptr_btCollisionObject[2])
            (this,constructionInfo->m_collisionShape);
  iVar13 = uniqueId + 1;
  this->m_debugBodyId = uniqueId;
  uniqueId = iVar13;
  setMassProps(this,constructionInfo->m_mass,&constructionInfo->m_localInertia);
  updateInertiaTensor(this);
  this->m_rigidbodyFlags = 8;
  (this->m_deltaLinearVelocity).m_floats[0] = 0.0;
  (this->m_deltaLinearVelocity).m_floats[1] = 0.0;
  (this->m_deltaLinearVelocity).m_floats[2] = 0.0;
  (this->m_deltaLinearVelocity).m_floats[3] = 0.0;
  (this->m_deltaAngularVelocity).m_floats[0] = 0.0;
  (this->m_deltaAngularVelocity).m_floats[1] = 0.0;
  (this->m_deltaAngularVelocity).m_floats[2] = 0.0;
  (this->m_deltaAngularVelocity).m_floats[3] = 0.0;
  uVar3 = this->m_inverseMass;
  uVar6 = (this->m_linearFactor).m_floats[0];
  auVar8._4_4_ = (this->m_linearFactor).m_floats[1] * (float)uVar3;
  auVar8._0_4_ = (float)uVar3 * (float)uVar6;
  auVar8._8_4_ = (float)uVar3 * (this->m_linearFactor).m_floats[2];
  auVar8._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_invMass).m_floats = auVar8;
  (this->m_pushVelocity).m_floats[0] = 0.0;
  (this->m_pushVelocity).m_floats[1] = 0.0;
  (this->m_pushVelocity).m_floats[2] = 0.0;
  (this->m_pushVelocity).m_floats[3] = 0.0;
  (this->m_turnVelocity).m_floats[0] = 0.0;
  (this->m_turnVelocity).m_floats[1] = 0.0;
  (this->m_turnVelocity).m_floats[2] = 0.0;
  (this->m_turnVelocity).m_floats[3] = 0.0;
  return;
}

Assistant:

void	btRigidBody::setupRigidBody(const btRigidBody::btRigidBodyConstructionInfo& constructionInfo)
{

	m_internalType=CO_RIGID_BODY;

	m_linearVelocity.setValue(btScalar(0.0), btScalar(0.0), btScalar(0.0));
	m_angularVelocity.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
	m_angularFactor.setValue(1,1,1);
	m_linearFactor.setValue(1,1,1);
	m_gravity.setValue(btScalar(0.0), btScalar(0.0), btScalar(0.0));
	m_gravity_acceleration.setValue(btScalar(0.0), btScalar(0.0), btScalar(0.0));
	m_totalForce.setValue(btScalar(0.0), btScalar(0.0), btScalar(0.0));
	m_totalTorque.setValue(btScalar(0.0), btScalar(0.0), btScalar(0.0)),
    setDamping(constructionInfo.m_linearDamping, constructionInfo.m_angularDamping);

	m_linearSleepingThreshold = constructionInfo.m_linearSleepingThreshold;
	m_angularSleepingThreshold = constructionInfo.m_angularSleepingThreshold;
	m_optionalMotionState = constructionInfo.m_motionState;
	m_contactSolverType = 0;
	m_frictionSolverType = 0;
	m_additionalDamping = constructionInfo.m_additionalDamping;
	m_additionalDampingFactor = constructionInfo.m_additionalDampingFactor;
	m_additionalLinearDampingThresholdSqr = constructionInfo.m_additionalLinearDampingThresholdSqr;
	m_additionalAngularDampingThresholdSqr = constructionInfo.m_additionalAngularDampingThresholdSqr;
	m_additionalAngularDampingFactor = constructionInfo.m_additionalAngularDampingFactor;

	if (m_optionalMotionState)
	{
		m_optionalMotionState->getWorldTransform(m_worldTransform);
	} else
	{
		m_worldTransform = constructionInfo.m_startWorldTransform;
	}

	m_interpolationWorldTransform = m_worldTransform;
	m_interpolationLinearVelocity.setValue(0,0,0);
	m_interpolationAngularVelocity.setValue(0,0,0);
	
	//moved to btCollisionObject
	m_friction = constructionInfo.m_friction;
	m_rollingFriction = constructionInfo.m_rollingFriction;
	m_restitution = constructionInfo.m_restitution;

	setCollisionShape( constructionInfo.m_collisionShape );
	m_debugBodyId = uniqueId++;
	
	setMassProps(constructionInfo.m_mass, constructionInfo.m_localInertia);
	updateInertiaTensor();

	m_rigidbodyFlags = BT_ENABLE_GYROSCOPIC_FORCE_IMPLICIT_BODY;


	m_deltaLinearVelocity.setZero();
	m_deltaAngularVelocity.setZero();
	m_invMass = m_inverseMass*m_linearFactor;
	m_pushVelocity.setZero();
	m_turnVelocity.setZero();

	

}